

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

void __thiscall
tchecker::reference_clock_variables_t::reference_clock_variables_t
          (reference_clock_variables_t *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *proc_refname_map)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  invalid_argument *this_00;
  const_reference name;
  reference pvVar4;
  uint local_30;
  clock_id_t refid;
  process_id_t pid;
  allocator<unsigned_int> local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *proc_refname_map_local;
  reference_clock_variables_t *this_local;
  
  local_18 = proc_refname_map;
  proc_refname_map_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  flat_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_variables_t(&this->super_flat_clock_variables_t);
  this->_refcount = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_refmap);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  std::allocator<unsigned_int>::allocator(&local_19);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_procmap,sVar3,&local_19);
  std::allocator<unsigned_int>::~allocator(&local_19);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(local_18);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Empty reference clocks not allowed");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (sVar3 < uVar2) {
    local_30 = 0;
    while( true ) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_18);
      if (sVar3 <= local_30) break;
      name = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,(ulong)local_30);
      uVar2 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::id((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,name);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_procmap,(ulong)local_30);
      *pvVar4 = uVar2;
      local_30 = local_30 + 1;
    }
    return;
  }
  __assert_fail("proc_refname_map.size() < std::numeric_limits<tchecker::process_id_t>::max()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                ,0x199,
                "tchecker::reference_clock_variables_t::reference_clock_variables_t(const std::vector<std::string> &)"
               );
}

Assistant:

reference_clock_variables_t::reference_clock_variables_t(std::vector<std::string> const & proc_refname_map)
    : _refcount(0), _procmap(proc_refname_map.size())
{
  if (proc_refname_map.empty())
    throw std::invalid_argument("Empty reference clocks not allowed");
  assert(proc_refname_map.size() < std::numeric_limits<tchecker::process_id_t>::max());
  for (tchecker::process_id_t pid = 0; pid < proc_refname_map.size(); ++pid) {
    tchecker::clock_id_t refid = 0;
    try {
      refid = tchecker::flat_clock_variables_t::id(proc_refname_map[pid]);
    }
    catch (...) {
      refid = declare_reference_clock(proc_refname_map[pid]);
    }
    _procmap[pid] = refid;
  }
}